

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_yank(EditLine *el,wint_t c)

{
  wchar_t *local_30;
  wchar_t *cp;
  wchar_t *kp;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_chared).c_kill.last == (el->el_chared).c_kill.buf) {
    el_local._7_1_ = '\0';
  }
  else if ((el->el_line).lastchar +
           ((long)(el->el_chared).c_kill.last - (long)(el->el_chared).c_kill.buf >> 2) <
           (el->el_line).limit) {
    (el->el_chared).c_kill.mark = (el->el_line).cursor;
    c_insert(el,(wchar_t)((long)(el->el_chared).c_kill.last - (long)(el->el_chared).c_kill.buf >> 2)
            );
    local_30 = (el->el_line).cursor;
    for (cp = (el->el_chared).c_kill.buf; cp < (el->el_chared).c_kill.last; cp = cp + 1) {
      *local_30 = *cp;
      local_30 = local_30 + 1;
    }
    if ((el->el_state).argument == L'\x01') {
      (el->el_line).cursor = local_30;
    }
    el_local._7_1_ = '\x04';
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_yank(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *kp, *cp;

	if (el->el_chared.c_kill.last == el->el_chared.c_kill.buf)
		return CC_NORM;

	if (el->el_line.lastchar +
	    (el->el_chared.c_kill.last - el->el_chared.c_kill.buf) >=
	    el->el_line.limit)
		return CC_ERROR;

	el->el_chared.c_kill.mark = el->el_line.cursor;

	/* open the space, */
	c_insert(el,
	    (int)(el->el_chared.c_kill.last - el->el_chared.c_kill.buf));
	cp = el->el_line.cursor;
	/* copy the chars */
	for (kp = el->el_chared.c_kill.buf; kp < el->el_chared.c_kill.last; kp++)
		*cp++ = *kp;

	/* if an arg, cursor at beginning else cursor at end */
	if (el->el_state.argument == 1)
		el->el_line.cursor = cp;

	return CC_REFRESH;
}